

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O3

void EditTableSizingFlags(ImGuiTableFlags *p_flags)

{
  bool bVar1;
  char **ppcVar2;
  ImGuiStyle *pIVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  float fVar7;
  ImVec2 local_38;
  
  ppcVar2 = &EditTableSizingFlags::policies[0].Name;
  lVar6 = 0;
  pcVar4 = "";
  do {
    if (((EnumDesc *)(ppcVar2 + -1))->Value == (*p_flags & 0xe000U)) {
      lVar5 = 0xf;
      if (lVar6 == 0) {
        lVar5 = 0;
      }
      pcVar4 = *ppcVar2 + lVar5;
      goto LAB_0014d02a;
    }
    lVar6 = lVar6 + 1;
    ppcVar2 = ppcVar2 + 3;
  } while (lVar6 != 5);
  lVar6 = 5;
LAB_0014d02a:
  bVar1 = ImGui::BeginCombo("Sizing Policy",pcVar4,0);
  if (bVar1) {
    lVar5 = 0;
    do {
      local_38.x = 0.0;
      local_38.y = 0.0;
      bVar1 = ImGui::Selectable(*(char **)((long)&EditTableSizingFlags::policies[0].Name + lVar5),
                                lVar6 * 0x18 == lVar5,0,&local_38);
      if (bVar1) {
        *p_flags = *p_flags & 0xffff1fffU |
                   *(uint *)((long)&EditTableSizingFlags::policies[0].Value + lVar5);
      }
      lVar5 = lVar5 + 0x18;
    } while (lVar5 != 0x78);
    ImGui::EndCombo();
  }
  ImGui::SameLine(0.0,-1.0);
  ImGui::TextDisabled("(?)");
  bVar1 = ImGui::IsItemHovered(0);
  if (bVar1) {
    ImGui::BeginTooltip();
    fVar7 = ImGui::GetFontSize();
    ImGui::PushTextWrapPos(fVar7 * 50.0);
    lVar6 = 0;
    do {
      ImGui::Separator();
      pcVar4 = *(char **)((long)&EditTableSizingFlags::policies[0].Tooltip + lVar6);
      ImGui::Text("%s:");
      ImGui::Separator();
      fVar7 = ImGui::GetCursorPosX();
      pIVar3 = ImGui::GetStyle();
      ImGui::SetCursorPosX(pIVar3->IndentSpacing * 0.5 + fVar7);
      ImGui::TextUnformatted(pcVar4,(char *)0x0);
      lVar6 = lVar6 + 0x18;
    } while (lVar6 != 0x78);
    ImGui::PopTextWrapPos();
    ImGui::EndTooltip();
  }
  return;
}

Assistant:

static void EditTableSizingFlags(ImGuiTableFlags* p_flags)
{
    struct EnumDesc { ImGuiTableFlags Value; const char* Name; const char* Tooltip; };
    static const EnumDesc policies[] =
    {
        { ImGuiTableFlags_None,               "Default",                            "Use default sizing policy:\n- ImGuiTableFlags_SizingFixedFit if ScrollX is on or if host window has ImGuiWindowFlags_AlwaysAutoResize.\n- ImGuiTableFlags_SizingStretchSame otherwise." },
        { ImGuiTableFlags_SizingFixedFit,     "ImGuiTableFlags_SizingFixedFit",     "Columns default to _WidthFixed (if resizable) or _WidthAuto (if not resizable), matching contents width." },
        { ImGuiTableFlags_SizingFixedSame,    "ImGuiTableFlags_SizingFixedSame",    "Columns are all the same width, matching the maximum contents width.\nImplicitly disable ImGuiTableFlags_Resizable and enable ImGuiTableFlags_NoKeepColumnsVisible." },
        { ImGuiTableFlags_SizingStretchProp,  "ImGuiTableFlags_SizingStretchProp",  "Columns default to _WidthStretch with weights proportional to their widths." },
        { ImGuiTableFlags_SizingStretchSame,  "ImGuiTableFlags_SizingStretchSame",  "Columns default to _WidthStretch with same weights." }
    };
    int idx;
    for (idx = 0; idx < IM_ARRAYSIZE(policies); idx++)
        if (policies[idx].Value == (*p_flags & ImGuiTableFlags_SizingMask_))
            break;
    const char* preview_text = (idx < IM_ARRAYSIZE(policies)) ? policies[idx].Name + (idx > 0 ? strlen("ImGuiTableFlags") : 0) : "";
    if (ImGui::BeginCombo("Sizing Policy", preview_text))
    {
        for (int n = 0; n < IM_ARRAYSIZE(policies); n++)
            if (ImGui::Selectable(policies[n].Name, idx == n))
                *p_flags = (*p_flags & ~ImGuiTableFlags_SizingMask_) | policies[n].Value;
        ImGui::EndCombo();
    }
    ImGui::SameLine();
    ImGui::TextDisabled("(?)");
    if (ImGui::IsItemHovered())
    {
        ImGui::BeginTooltip();
        ImGui::PushTextWrapPos(ImGui::GetFontSize() * 50.0f);
        for (int m = 0; m < IM_ARRAYSIZE(policies); m++)
        {
            ImGui::Separator();
            ImGui::Text("%s:", policies[m].Name);
            ImGui::Separator();
            ImGui::SetCursorPosX(ImGui::GetCursorPosX() + ImGui::GetStyle().IndentSpacing * 0.5f);
            ImGui::TextUnformatted(policies[m].Tooltip);
        }
        ImGui::PopTextWrapPos();
        ImGui::EndTooltip();
    }
}